

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O0

void __thiscall QKeySequenceEdit::keyPressEvent(QKeySequenceEdit *this,QKeyEvent *e)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Int IVar4;
  Int IVar5;
  QKeySequenceEditPrivate *__addr_len;
  qsizetype qVar6;
  const_reference this_00;
  QKeyCombination *this_01;
  sockaddr *__addr;
  QKeyEvent *in_RSI;
  long in_FS_OFFSET;
  int key;
  int i;
  bool found;
  int pkTotal;
  int nextKey;
  QKeySequenceEditPrivate *d;
  QString text;
  QList<QKeyCombination> possibleKeys;
  QString selectedText;
  int in_stack_fffffffffffffe88;
  KeyboardModifier in_stack_fffffffffffffe8c;
  QKeySequenceEditPrivate *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  QString *in_stack_fffffffffffffea8;
  undefined6 in_stack_fffffffffffffeb0;
  byte bVar7;
  byte bVar8;
  int in_stack_fffffffffffffedc;
  QChar fillChar;
  int local_120;
  QChar local_ea [25];
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  int local_9c;
  undefined4 local_7c;
  QList<QKeyCombination> local_78;
  undefined4 local_60;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_5c;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __addr_len = d_func((QKeySequenceEdit *)0x5a751b);
  local_c = (int)QKeyEvent::keyCombination((QKeyEvent *)in_stack_fffffffffffffe90);
  bVar1 = QListSpecialMethodsBase<QKeyCombination>::contains<QKeyCombination>
                    ((QListSpecialMethodsBase<QKeyCombination> *)in_stack_fffffffffffffe90,
                     (QKeyCombination *)
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  if (bVar1) {
    QKeySequenceEditPrivate::finishEditing(in_stack_fffffffffffffe90);
    goto LAB_005a7ac7;
  }
  iVar3 = QKeyEvent::key(in_RSI);
  if (__addr_len->prevKey == -1) {
    clear((QKeySequenceEdit *)in_stack_fffffffffffffe90);
    __addr_len->prevKey = iVar3;
  }
  QString::QString((QString *)0x5a75bb);
  QLineEdit::setPlaceholderText
            ((QLineEdit *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (QString *)CONCAT44(in_stack_fffffffffffffe9c.i,in_stack_fffffffffffffe98));
  QString::~QString((QString *)0x5a75da);
  if ((((iVar3 == 0x1000021) || (iVar3 == 0x1000020)) || (iVar3 == 0x1000022)) ||
     ((iVar3 == 0x1000023 || (iVar3 == 0x1ffffff)))) goto LAB_005a7ac7;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::selectedText
            ((QLineEdit *)CONCAT44(in_stack_fffffffffffffe9c.i,in_stack_fffffffffffffe98));
  bVar1 = QString::isEmpty((QString *)0x5a7664);
  bVar7 = 0;
  bVar8 = bVar7;
  if (!bVar1) {
    QLineEdit::text((QLineEdit *)CONCAT44(in_stack_fffffffffffffe9c.i,in_stack_fffffffffffffe98));
    bVar7 = ::operator==((QString *)in_stack_fffffffffffffe90,
                         (QString *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    bVar8 = bVar7;
    QString::~QString((QString *)0x5a76cb);
  }
  if ((((bVar7 & 1) == 0) ||
      (clear((QKeySequenceEdit *)in_stack_fffffffffffffe90), iVar3 != 0x1000003)) &&
     (__addr_len->keyNum < __addr_len->maximumSequenceLength)) {
    local_60 = QKeyEvent::modifiers();
    local_5c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&
                   ((QFlags<Qt::KeyboardModifier> *)in_stack_fffffffffffffe90,
                    in_stack_fffffffffffffe8c);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_5c);
    fillChar.ucs = (char16_t)((uint)in_stack_fffffffffffffedc >> 0x10);
    if (IVar4 == 0) {
      in_stack_fffffffffffffe90 = __addr_len;
      QKeyEvent::modifiers();
      QKeyEvent::text((QKeyEvent *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QKeySequenceEditPrivate::translateModifiers
                ((QKeySequenceEditPrivate *)
                 CONCAT44(in_stack_fffffffffffffe9c.i,in_stack_fffffffffffffe98),
                 (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                 SUB84((ulong)in_stack_fffffffffffffea8 >> 0x20,0),
                 (QString *)in_stack_fffffffffffffe90);
      QString::~QString((QString *)0x5a794b);
    }
    else {
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (QKeyCombination *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QKeyMapper::possibleKeys((QKeyEvent *)&local_78);
      qVar6 = QList<QKeyCombination>::size(&local_78);
      fillChar.ucs = (char16_t)((uint)in_stack_fffffffffffffedc >> 0x10);
      if ((int)qVar6 == 0) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
        local_120 = 0;
        while( true ) {
          fillChar.ucs = (char16_t)((uint)in_stack_fffffffffffffedc >> 0x10);
          in_stack_fffffffffffffea8 = (QString *)(long)local_120;
          qVar6 = QList<QKeyCombination>::size(&local_78);
          if (qVar6 <= (long)in_stack_fffffffffffffea8) break;
          this_00 = QList<QKeyCombination>::at
                              ((QList<QKeyCombination> *)in_stack_fffffffffffffe90,
                               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          in_stack_fffffffffffffedc = QKeyCombination::toCombined(this_00);
          IVar4 = in_stack_fffffffffffffedc - iVar3;
          local_7c = QKeyEvent::modifiers();
          IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_7c);
          in_stack_fffffffffffffea4 = CONCAT13(1,(int3)in_stack_fffffffffffffea4);
          if (IVar4 != IVar5) {
            in_stack_fffffffffffffe9c.i = in_stack_fffffffffffffe9c.i & 0xffffff;
            if (in_stack_fffffffffffffedc == iVar3) {
              QKeyEvent::modifiers();
              bVar2 = ::operator==((QFlags<Qt::KeyboardModifier>)in_stack_fffffffffffffe9c.i,
                                   (KeyboardModifier)in_stack_fffffffffffffe90);
              in_stack_fffffffffffffe9c.i = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe9c.i);
            }
            in_stack_fffffffffffffea4 =
                 CONCAT13((char)(in_stack_fffffffffffffe9c.i >> 0x18),
                          (int3)in_stack_fffffffffffffea4);
          }
          fillChar.ucs = (char16_t)((uint)in_stack_fffffffffffffedc >> 0x10);
          if ((char)((uint)in_stack_fffffffffffffea4 >> 0x18) != '\0') {
            bVar1 = true;
            break;
          }
          local_120 = local_120 + 1;
        }
        if (!bVar1) {
          this_01 = QList<QKeyCombination>::first
                              ((QList<QKeyCombination> *)in_stack_fffffffffffffe90);
          QKeyCombination::toCombined(this_01);
        }
        bVar1 = false;
      }
      QList<QKeyCombination>::~QList((QList<QKeyCombination> *)0x5a78e6);
      if (bVar1) goto LAB_005a7aba;
    }
    local_9c = (int)QKeyCombination::fromCombined(in_stack_fffffffffffffe88);
    __addr_len->key[__addr_len->keyNum].combination = local_9c;
    __addr_len->keyNum = __addr_len->keyNum + 1;
    QKeySequenceEditPrivate::rebuildKeySequence(in_stack_fffffffffffffe90);
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    QKeySequence::toString((SequenceFormat)&local_b8);
    if (__addr_len->keyNum < __addr_len->maximumSequenceLength) {
      tr((char *)CONCAT44(in_stack_fffffffffffffe9c.i,in_stack_fffffffffffffe98),
         (char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      QChar::QChar<char16_t,_true>(local_ea,L' ');
      __addr_len = (QKeySequenceEditPrivate *)0x0;
      QString::arg<QString,_true>
                ((QString *)CONCAT17(bVar8,CONCAT16(bVar7,in_stack_fffffffffffffeb0)),
                 in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,fillChar);
      QString::operator=((QString *)in_stack_fffffffffffffe90,
                         (QString *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QString::~QString((QString *)0x5a7a75);
      QString::~QString((QString *)0x5a7a82);
    }
    iVar3 = (int)&local_b8;
    QLineEdit::setText((QLineEdit *)in_stack_fffffffffffffe90,
                       (QString *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    QEvent::accept((QEvent *)in_RSI,iVar3,__addr,(socklen_t *)__addr_len);
    QString::~QString((QString *)0x5a7ab2);
  }
LAB_005a7aba:
  QString::~QString((QString *)0x5a7ac7);
LAB_005a7ac7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QKeySequenceEdit::keyPressEvent(QKeyEvent *e)
{
    Q_D(QKeySequenceEdit);

    if (d->finishingKeyCombinations.contains(e->keyCombination())) {
        d->finishEditing();
        return;
    }

    int nextKey = e->key();

    if (d->prevKey == -1) {
        clear();
        d->prevKey = nextKey;
    }

    d->lineEdit->setPlaceholderText(QString());
    if (nextKey == Qt::Key_Control
            || nextKey == Qt::Key_Shift
            || nextKey == Qt::Key_Meta
            || nextKey == Qt::Key_Alt
            || nextKey == Qt::Key_unknown) {
        return;
    }

    QString selectedText = d->lineEdit->selectedText();
    if (!selectedText.isEmpty() && selectedText == d->lineEdit->text()) {
        clear();
        if (nextKey == Qt::Key_Backspace)
            return;
    }

    if (d->keyNum >= d->maximumSequenceLength)
        return;

    if (e->modifiers() & Qt::ShiftModifier) {
        const QList<QKeyCombination> possibleKeys = QKeyMapper::possibleKeys(e);
        int pkTotal = possibleKeys.size();
        if (!pkTotal)
            return;
        bool found = false;
        for (int i = 0; i < possibleKeys.size(); ++i) {
            const int key = possibleKeys.at(i).toCombined();
            if (key - nextKey == int(e->modifiers())
                || (key == nextKey && e->modifiers() == Qt::ShiftModifier)) {
                nextKey = key;
                found = true;
                break;
            }
        }
        // Use as fallback
        if (!found)
            nextKey = possibleKeys.first().toCombined();
    } else {
        nextKey |= d->translateModifiers(e->modifiers(), e->text());
    }


    d->key[d->keyNum] = QKeyCombination::fromCombined(nextKey);
    d->keyNum++;

    d->rebuildKeySequence();
    QString text = d->keySequence.toString(QKeySequence::NativeText);
    if (d->keyNum < d->maximumSequenceLength) {
        //: This text is an "unfinished" shortcut, expands like "Ctrl+A, ..."
        text = tr("%1, ...").arg(text);
    }
    d->lineEdit->setText(text);
    e->accept();
}